

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledImage::RenderElement
          (DecoratorTiledImage *this,Element *element,DecoratorDataHandle element_data)

{
  CompiledShader local_58;
  Texture local_40;
  Vector2f local_30;
  DecoratorDataHandle local_28;
  Geometry *data;
  DecoratorDataHandle element_data_local;
  Element *element_local;
  DecoratorTiledImage *this_local;
  
  local_28 = element_data;
  data = (Geometry *)element_data;
  element_data_local = (DecoratorDataHandle)element;
  element_local = (Element *)this;
  local_30 = Element::GetAbsoluteOffset(element,Border);
  local_40 = Decorator::GetTexture((Decorator *)this,0);
  local_58.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)0x0;
  local_58.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0;
  CompiledShader::CompiledShader(&local_58);
  Geometry::Render((Geometry *)element_data,local_30,local_40,&local_58);
  CompiledShader::~CompiledShader(&local_58);
  return;
}

Assistant:

void DecoratorTiledImage::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	Geometry* data = reinterpret_cast<Geometry*>(element_data);
	data->Render(element->GetAbsoluteOffset(BoxArea::Border), GetTexture());
}